

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

bool crnlib::unpack_etc1(etc1_block *block,color_quad_u8 *pDst,bool preserve_alpha)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  ushort packed_color5;
  uint table_idx;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  color_quad_u8 acStack_58 [4];
  color_quad_u8 local_48 [4];
  uint local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,preserve_alpha);
  bVar1 = (block->field_0).m_bytes[3];
  uVar7 = (uint)bVar1;
  table_idx = bVar1 >> 2 & 7;
  bVar2 = (block->field_0).m_bytes[0];
  uVar6 = (uint)bVar2;
  if ((bVar1 & 2) == 0) {
    bVar3 = (block->field_0).m_bytes[1];
    local_38 = (uint)bVar1;
    bVar4 = (block->field_0).m_bytes[2];
    etc1_block::get_abs_subblock_colors
              (local_48,(ushort)((uVar6 & 0xf0) << 4) | (ushort)(byte)(bVar4 >> 4 | bVar3 & 0xf0),
               (uint)(bVar1 >> 5));
    uVar7 = local_38;
    etc1_block::get_abs_subblock_colors
              (acStack_58,CONCAT11(bVar2,bVar3 << 4 | bVar4 & 0xf) & 0xfff,table_idx);
    bVar5 = true;
  }
  else {
    bVar2 = (block->field_0).m_bytes[1];
    bVar3 = (block->field_0).m_bytes[2];
    packed_color5 = (ushort)((uVar6 & 0xf8) << 7) | (ushort)(bVar3 >> 3) + (bVar2 & 0xfff8) * 4;
    etc1_block::get_diff_subblock_colors(local_48,packed_color5,(uint)(bVar1 >> 5));
    bVar5 = etc1_block::get_diff_subblock_colors
                      (acStack_58,packed_color5,
                       (ushort)((uVar6 & 7) << 6) | (bVar3 & 7) + (bVar2 & 7) * 8,table_idx);
  }
  if ((char)local_34 == '\0') {
    uVar6 = 0;
    if ((uVar7 & 1) == 0) {
      do {
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        (pDst->field_0).field_0.r = local_48[bVar1].field_0.field_0.r;
        (pDst->field_0).field_0.g = local_48[bVar1].field_0.field_0.g;
        (pDst->field_0).field_0.b = local_48[bVar1].field_0.field_0.b;
        (pDst->field_0).field_0.a = local_48[bVar1].field_0.field_0.a;
        uVar7 = uVar6 + 4;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[1].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[1].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[1].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        pDst[1].field_0.field_0.a = local_48[bVar1].field_0.field_0.a;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[2].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[2].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[2].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        pDst[2].field_0.field_0.a = acStack_58[bVar1].field_0.field_0.a;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[3].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[3].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[3].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        pDst[3].field_0.field_0.a = acStack_58[bVar1].field_0.field_0.a;
        pDst = pDst + 4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 4);
    }
    else {
      do {
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        (pDst->field_0).field_0.r = local_48[bVar1].field_0.field_0.r;
        (pDst->field_0).field_0.g = local_48[bVar1].field_0.field_0.g;
        (pDst->field_0).field_0.b = local_48[bVar1].field_0.field_0.b;
        (pDst->field_0).field_0.a = local_48[bVar1].field_0.field_0.a;
        uVar7 = uVar6 + 4;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[1].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[1].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[1].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        pDst[1].field_0.field_0.a = local_48[bVar1].field_0.field_0.a;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[2].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[2].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[2].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        pDst[2].field_0.field_0.a = local_48[bVar1].field_0.field_0.a;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[3].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[3].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[3].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        pDst[3].field_0.field_0.a = local_48[bVar1].field_0.field_0.a;
        pDst = pDst + 4;
        uVar6 = uVar6 + 1;
      } while (uVar7 == 4);
      uVar7 = 2;
      do {
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        (pDst->field_0).field_0.r = acStack_58[bVar1].field_0.field_0.r;
        (pDst->field_0).field_0.g = acStack_58[bVar1].field_0.field_0.g;
        (pDst->field_0).field_0.b = acStack_58[bVar1].field_0.field_0.b;
        (pDst->field_0).field_0.a = acStack_58[bVar1].field_0.field_0.a;
        uVar6 = uVar7 + 4;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[1].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[1].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[1].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        pDst[1].field_0.field_0.a = acStack_58[bVar1].field_0.field_0.a;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[2].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[2].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[2].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        pDst[2].field_0.field_0.a = acStack_58[bVar1].field_0.field_0.a;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[3].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[3].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[3].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        pDst[3].field_0.field_0.a = acStack_58[bVar1].field_0.field_0.a;
        pDst = pDst + 4;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
    }
  }
  else {
    uVar6 = 0;
    if ((uVar7 & 1) == 0) {
      do {
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        (pDst->field_0).field_0.r = local_48[bVar1].field_0.field_0.r;
        (pDst->field_0).field_0.g = local_48[bVar1].field_0.field_0.g;
        (pDst->field_0).field_0.b = local_48[bVar1].field_0.field_0.b;
        uVar7 = uVar6 + 4;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[1].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[1].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[1].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[2].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[2].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[2].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[3].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[3].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[3].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        pDst = pDst + 4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 4);
    }
    else {
      do {
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        (pDst->field_0).field_0.r = local_48[bVar1].field_0.field_0.r;
        (pDst->field_0).field_0.g = local_48[bVar1].field_0.field_0.g;
        (pDst->field_0).field_0.b = local_48[bVar1].field_0.field_0.b;
        uVar7 = uVar6 + 4;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[1].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[1].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[1].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[2].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[2].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[2].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[3].field_0.field_0.r = local_48[bVar1].field_0.field_0.r;
        pDst[3].field_0.field_0.g = local_48[bVar1].field_0.field_0.g;
        pDst[3].field_0.field_0.b = local_48[bVar1].field_0.field_0.b;
        pDst = pDst + 4;
        uVar6 = uVar6 + 1;
      } while (uVar7 == 4);
      uVar7 = 2;
      do {
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        (pDst->field_0).field_0.r = acStack_58[bVar1].field_0.field_0.r;
        (pDst->field_0).field_0.g = acStack_58[bVar1].field_0.field_0.g;
        (pDst->field_0).field_0.b = acStack_58[bVar1].field_0.field_0.b;
        uVar6 = uVar7 + 4;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[5] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[1].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[1].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[1].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2));
        pDst[2].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[2].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[2].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                         (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar6 & 0x1f) & 1) != 0) +
                                ((block->field_0).m_bytes[4] >> ((byte)uVar6 & 0x1f) & 1) * 2));
        pDst[3].field_0.field_0.r = acStack_58[bVar1].field_0.field_0.r;
        pDst[3].field_0.field_0.g = acStack_58[bVar1].field_0.field_0.g;
        pDst[3].field_0.field_0.b = acStack_58[bVar1].field_0.field_0.b;
        pDst = pDst + 4;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
    }
  }
  return bVar5;
}

Assistant:

bool unpack_etc1(const etc1_block& block, color_quad_u8* pDst, bool preserve_alpha)
    {
        const bool diff_flag = block.get_diff_bit();
        const bool flip_flag = block.get_flip_bit();
        const uint table_index0 = block.get_inten_table(0);
        const uint table_index1 = block.get_inten_table(1);

        color_quad_u8 subblock_colors0[4];
        color_quad_u8 subblock_colors1[4];
        bool success = true;

        if (diff_flag)
        {
            const uint16 base_color5 = block.get_base5_color();
            const uint16 delta_color3 = block.get_delta3_color();
            etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

            if (!etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
            {
                success = false;
            }
        }
        else
        {
            const uint16 base_color4_0 = block.get_base4_color(0);
            etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

            const uint16 base_color4_1 = block.get_base4_color(1);
            etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
        }

        if (preserve_alpha)
        {
            if (flip_flag)
            {
                for (uint y = 0; y < 2; y++)
                {
                    pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                    pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                    pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
                    pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
                    pDst += 4;
                }

                for (uint y = 2; y < 4; y++)
                {
                    pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
                    pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
                    pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                    pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                    pDst += 4;
                }
            }
            else
            {
                for (uint y = 0; y < 4; y++)
                {
                    pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                    pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                    pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                    pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                    pDst += 4;
                }
            }
        }
        else
        {
            if (flip_flag)
            {
                // 0000
                // 0000
                // 1111
                // 1111
                for (uint y = 0; y < 2; y++)
                {
                    pDst[0] = subblock_colors0[block.get_selector(0, y)];
                    pDst[1] = subblock_colors0[block.get_selector(1, y)];
                    pDst[2] = subblock_colors0[block.get_selector(2, y)];
                    pDst[3] = subblock_colors0[block.get_selector(3, y)];
                    pDst += 4;
                }

                for (uint y = 2; y < 4; y++)
                {
                    pDst[0] = subblock_colors1[block.get_selector(0, y)];
                    pDst[1] = subblock_colors1[block.get_selector(1, y)];
                    pDst[2] = subblock_colors1[block.get_selector(2, y)];
                    pDst[3] = subblock_colors1[block.get_selector(3, y)];
                    pDst += 4;
                }
            }
            else
            {
                // 0011
                // 0011
                // 0011
                // 0011
                for (uint y = 0; y < 4; y++)
                {
                    pDst[0] = subblock_colors0[block.get_selector(0, y)];
                    pDst[1] = subblock_colors0[block.get_selector(1, y)];
                    pDst[2] = subblock_colors1[block.get_selector(2, y)];
                    pDst[3] = subblock_colors1[block.get_selector(3, y)];
                    pDst += 4;
                }
            }
        }

        return success;
    }